

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

void __thiscall
Assimp::FBX::FBXConverter::GetRotationMatrix
          (FBXConverter *this,RotOrder mode,aiVector3D *rotation,aiMatrix4x4 *out)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  bool bVar33;
  float *pfVar34;
  long lVar35;
  bool *pbVar36;
  float *pfVar37;
  bool *pbVar38;
  bool *pbVar39;
  float *pfVar40;
  float fVar41;
  aiMatrix4x4 temp [3];
  bool local_153 [91];
  undefined1 local_f8 [16];
  float local_e8;
  undefined8 auStack_e4 [2];
  float fStack_d4;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  float local_c0;
  undefined8 local_bc [2];
  float local_ac [9];
  undefined8 uStack_88;
  float local_80;
  undefined8 local_7c;
  undefined8 uStack_74;
  undefined4 local_6c;
  float local_68;
  undefined8 local_64;
  undefined8 uStack_5c;
  float local_54;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined4 local_40;
  undefined8 local_3c;
  undefined8 uStack_34;
  undefined4 local_2c;
  
  if (mode == RotOrder_SphericXYZ) {
    LogFunctions<Assimp::FBXImporter>::LogError((char *)0x174863);
    out->a1 = 1.0;
    out->a2 = 0.0;
    out->a3 = 0.0;
    out->a4 = 0.0;
    out->b1 = 0.0;
    out->b2 = 1.0;
    out->b3 = 0.0;
    out->b4 = 0.0;
    out->c1 = 0.0;
    out->c2 = 0.0;
    out->c3 = 1.0;
    out->c4 = 0.0;
    out->d1 = 0.0;
    out->d2 = 0.0;
    out->d3 = 0.0;
    out->d4 = 1.0;
    return;
  }
  pfVar1 = local_ac + 1;
  pfVar37 = &local_68;
  out->a1 = 1.0;
  out->a2 = 0.0;
  out->a3 = 0.0;
  out->a4 = 0.0;
  out->b1 = 0.0;
  out->b2 = 1.0;
  out->b3 = 0.0;
  out->b4 = 0.0;
  out->c1 = 0.0;
  out->c2 = 0.0;
  out->c3 = 1.0;
  out->c4 = 0.0;
  out->d1 = 0.0;
  out->d2 = 0.0;
  out->d3 = 0.0;
  out->d4 = 1.0;
  local_153[2] = true;
  local_153[1] = true;
  local_153[0] = true;
  lVar35 = 0;
  do {
    *(undefined4 *)((long)&local_e8 + lVar35) = 0x3f800000;
    *(undefined8 *)((long)auStack_e4 + lVar35) = 0;
    *(undefined8 *)((long)auStack_e4 + lVar35 + 8) = 0;
    *(undefined4 *)((long)&fStack_d4 + lVar35) = 0x3f800000;
    *(undefined8 *)((long)&uStack_d0 + lVar35) = 0;
    *(undefined8 *)((long)&uStack_c8 + lVar35) = 0;
    *(undefined4 *)((long)&local_c0 + lVar35) = 0x3f800000;
    *(undefined8 *)((long)local_bc + lVar35) = 0;
    *(undefined8 *)((long)local_bc + lVar35 + 8) = 0;
    *(undefined4 *)((long)local_ac + lVar35) = 0x3f800000;
    lVar35 = lVar35 + 0x40;
  } while (lVar35 != 0xc0);
  bVar33 = 1.1920929e-07 < ABS(rotation->z);
  if (bVar33) {
    fVar41 = rotation->z * 0.017453292;
    local_f8 = ZEXT416((uint)fVar41);
    local_68 = 1.0;
    local_64 = 0;
    uStack_5c = 0;
    local_54 = 1.0;
    local_50 = 0;
    uStack_48 = 0;
    local_40 = 0x3f800000;
    local_3c = 0;
    uStack_34 = 0;
    local_2c = 0x3f800000;
    local_68 = cosf(fVar41);
    local_54 = local_68;
    fVar41 = sinf((float)local_f8._0_4_);
    uStack_5c = CONCAT44(fVar41,(undefined4)uStack_5c);
    local_64 = CONCAT44(local_64._4_4_,fVar41) ^ 0x80000000;
    local_153[0] = false;
  }
  local_153[0] = !bVar33;
  if (1.1920929e-07 < ABS(rotation->y)) {
    fVar41 = rotation->y * 0.017453292;
    local_f8 = ZEXT416((uint)fVar41);
    local_ac[1] = 1.0;
    local_ac[2] = 0.0;
    local_ac[3] = 0.0;
    local_ac[4] = 0.0;
    local_ac[5] = 0.0;
    local_ac[6] = 1.0;
    local_ac[7] = 0.0;
    local_ac[8] = 0.0;
    uStack_88 = 0;
    local_80 = 1.0;
    local_7c = 0;
    uStack_74 = 0;
    local_6c = 0x3f800000;
    local_ac[1] = cosf(fVar41);
    local_80 = local_ac[1];
    fVar41 = sinf((float)local_f8._0_4_);
    local_ac[3] = fVar41;
    uStack_88 = CONCAT44(uStack_88._4_4_,fVar41) ^ 0x80000000;
    local_153[1] = false;
  }
  if (1.1920929e-07 < ABS(rotation->x)) {
    fVar41 = rotation->x * 0.017453292;
    local_f8 = ZEXT416((uint)fVar41);
    local_e8 = 1.0;
    auStack_e4[0] = 0;
    auStack_e4[1] = 0;
    fStack_d4 = 1.0;
    uStack_d0 = 0;
    uStack_c8 = 0;
    local_c0 = 1.0;
    local_bc[0] = 0;
    local_bc[1] = 0;
    local_ac[0] = 1.0;
    fStack_d4 = cosf(fVar41);
    local_c0 = fStack_d4;
    fVar41 = sinf((float)local_f8._0_4_);
    uStack_c8 = CONCAT44(fVar41,(undefined4)uStack_c8);
    uStack_d0 = CONCAT44(uStack_d0._4_4_,fVar41) ^ 0x80000000;
    local_153[2] = false;
  }
  pfVar34 = pfVar37;
  pfVar40 = pfVar37;
  switch(mode) {
  case RotOrder_EulerXYZ:
    pbVar38 = local_153;
    pbVar36 = local_153 + 2;
    pfVar34 = &local_e8;
    break;
  case RotOrder_EulerXZY:
    pbVar39 = local_153;
    pbVar36 = local_153 + 2;
    pfVar34 = &local_e8;
    goto LAB_00174b7c;
  case RotOrder_EulerYZX:
    pbVar38 = local_153 + 2;
    pfVar40 = &local_e8;
    pbVar39 = local_153;
    goto LAB_00174b5b;
  case RotOrder_EulerYXZ:
    pbVar38 = local_153;
    pbVar39 = local_153 + 2;
    pfVar37 = &local_e8;
LAB_00174b5b:
    pbVar36 = local_153 + 1;
    pfVar34 = pfVar1;
    goto LAB_00174b9b;
  case RotOrder_EulerZXY:
    pbVar39 = local_153 + 2;
    pbVar36 = local_153;
    pfVar37 = &local_e8;
LAB_00174b7c:
    pbVar38 = local_153 + 1;
    pfVar40 = pfVar1;
    goto LAB_00174b9b;
  case RotOrder_EulerZYX:
    pbVar38 = local_153 + 2;
    pbVar36 = local_153;
    pfVar40 = &local_e8;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                  ,0x26b,
                  "void Assimp::FBX::FBXConverter::GetRotationMatrix(Model::RotOrder, const aiVector3D &, aiMatrix4x4 &)"
                 );
  }
  pbVar39 = local_153 + 1;
  pfVar37 = pfVar1;
LAB_00174b9b:
  if (*pbVar38 == false) {
    fVar12 = pfVar40[0];
    fVar13 = pfVar40[1];
    fVar14 = pfVar40[2];
    fVar15 = pfVar40[3];
    fVar8 = pfVar40[4];
    fVar9 = pfVar40[5];
    fVar10 = pfVar40[6];
    fVar11 = pfVar40[7];
    fVar4 = pfVar40[8];
    fVar5 = pfVar40[9];
    fVar6 = pfVar40[10];
    fVar7 = pfVar40[0xb];
    fVar41 = pfVar40[0xd];
    fVar2 = pfVar40[0xe];
    fVar3 = pfVar40[0xf];
    out->d1 = pfVar40[0xc];
    out->d2 = fVar41;
    out->d3 = fVar2;
    out->d4 = fVar3;
    out->c1 = fVar4;
    out->c2 = fVar5;
    out->c3 = fVar6;
    out->c4 = fVar7;
    out->b1 = fVar8;
    out->b2 = fVar9;
    out->b3 = fVar10;
    out->b4 = fVar11;
    out->a1 = fVar12;
    out->a2 = fVar13;
    out->a3 = fVar14;
    out->a4 = fVar15;
  }
  if (*pbVar39 == false) {
    fVar41 = out->a1;
    fVar2 = out->a2;
    fVar3 = out->a3;
    fVar4 = out->a4;
    fVar5 = pfVar37[4];
    fVar6 = *pfVar37;
    fVar7 = pfVar37[1];
    fVar8 = pfVar37[8];
    fVar9 = pfVar37[0xc];
    fVar10 = pfVar37[5];
    fVar11 = pfVar37[9];
    fVar12 = pfVar37[0xd];
    fVar13 = pfVar37[6];
    fVar14 = pfVar37[2];
    fVar15 = pfVar37[10];
    fVar16 = pfVar37[0xe];
    fVar17 = pfVar37[7];
    fVar18 = pfVar37[3];
    fVar19 = pfVar37[0xb];
    fVar20 = pfVar37[0xf];
    fVar21 = out->b2;
    fVar22 = out->b1;
    fVar23 = out->b3;
    fVar24 = out->b4;
    fVar25 = out->c2;
    fVar26 = out->c1;
    fVar27 = out->c3;
    fVar28 = out->c4;
    fVar29 = out->d2;
    fVar30 = out->d1;
    fVar31 = out->d3;
    fVar32 = out->d4;
    out->a1 = fVar9 * fVar4 + fVar8 * fVar3 + fVar6 * fVar41 + fVar2 * fVar5;
    out->a2 = fVar12 * fVar4 + fVar11 * fVar3 + fVar7 * fVar41 + fVar2 * fVar10;
    out->a3 = fVar16 * fVar4 + fVar15 * fVar3 + fVar14 * fVar41 + fVar2 * fVar13;
    out->a4 = fVar4 * fVar20 + fVar3 * fVar19 + fVar41 * fVar18 + fVar2 * fVar17;
    out->b1 = fVar9 * fVar24 + fVar8 * fVar23 + fVar6 * fVar22 + fVar21 * fVar5;
    out->b2 = fVar12 * fVar24 + fVar11 * fVar23 + fVar7 * fVar22 + fVar21 * fVar10;
    out->b3 = fVar16 * fVar24 + fVar15 * fVar23 + fVar14 * fVar22 + fVar21 * fVar13;
    out->b4 = fVar24 * fVar20 + fVar23 * fVar19 + fVar22 * fVar18 + fVar21 * fVar17;
    out->c1 = fVar9 * fVar28 + fVar8 * fVar27 + fVar6 * fVar26 + fVar25 * fVar5;
    out->c2 = fVar12 * fVar28 + fVar11 * fVar27 + fVar7 * fVar26 + fVar25 * fVar10;
    out->c3 = fVar16 * fVar28 + fVar15 * fVar27 + fVar14 * fVar26 + fVar25 * fVar13;
    out->c4 = fVar28 * fVar20 + fVar27 * fVar19 + fVar26 * fVar18 + fVar25 * fVar17;
    out->d1 = fVar9 * fVar32 + fVar8 * fVar31 + fVar6 * fVar30 + fVar5 * fVar29;
    out->d2 = fVar12 * fVar32 + fVar11 * fVar31 + fVar7 * fVar30 + fVar10 * fVar29;
    out->d3 = fVar16 * fVar32 + fVar15 * fVar31 + fVar14 * fVar30 + fVar13 * fVar29;
    out->d4 = fVar20 * fVar32 + fVar19 * fVar31 + fVar18 * fVar30 + fVar29 * fVar17;
  }
  if (*pbVar36 == false) {
    fVar41 = out->a1;
    fVar2 = out->a2;
    fVar3 = out->a3;
    fVar4 = out->a4;
    fVar5 = pfVar34[4];
    fVar6 = *pfVar34;
    fVar7 = pfVar34[1];
    fVar8 = pfVar34[8];
    fVar9 = pfVar34[0xc];
    fVar10 = pfVar34[5];
    fVar11 = pfVar34[9];
    fVar12 = pfVar34[0xd];
    fVar13 = pfVar34[6];
    fVar14 = pfVar34[2];
    fVar15 = pfVar34[10];
    fVar16 = pfVar34[0xe];
    fVar17 = pfVar34[7];
    fVar18 = pfVar34[3];
    fVar19 = pfVar34[0xb];
    fVar20 = pfVar34[0xf];
    fVar21 = out->b2;
    fVar22 = out->b1;
    fVar23 = out->b3;
    fVar24 = out->b4;
    fVar25 = out->c2;
    fVar26 = out->c1;
    fVar27 = out->c3;
    fVar28 = out->c4;
    fVar29 = out->d2;
    fVar30 = out->d1;
    fVar31 = out->d3;
    fVar32 = out->d4;
    out->a1 = fVar9 * fVar4 + fVar8 * fVar3 + fVar6 * fVar41 + fVar2 * fVar5;
    out->a2 = fVar12 * fVar4 + fVar11 * fVar3 + fVar7 * fVar41 + fVar2 * fVar10;
    out->a3 = fVar16 * fVar4 + fVar15 * fVar3 + fVar14 * fVar41 + fVar2 * fVar13;
    out->a4 = fVar4 * fVar20 + fVar3 * fVar19 + fVar41 * fVar18 + fVar2 * fVar17;
    out->b1 = fVar9 * fVar24 + fVar8 * fVar23 + fVar6 * fVar22 + fVar21 * fVar5;
    out->b2 = fVar12 * fVar24 + fVar11 * fVar23 + fVar7 * fVar22 + fVar21 * fVar10;
    out->b3 = fVar16 * fVar24 + fVar15 * fVar23 + fVar14 * fVar22 + fVar21 * fVar13;
    out->b4 = fVar24 * fVar20 + fVar23 * fVar19 + fVar22 * fVar18 + fVar21 * fVar17;
    out->c1 = fVar9 * fVar28 + fVar8 * fVar27 + fVar6 * fVar26 + fVar25 * fVar5;
    out->c2 = fVar12 * fVar28 + fVar11 * fVar27 + fVar7 * fVar26 + fVar25 * fVar10;
    out->c3 = fVar16 * fVar28 + fVar15 * fVar27 + fVar14 * fVar26 + fVar25 * fVar13;
    out->c4 = fVar28 * fVar20 + fVar27 * fVar19 + fVar26 * fVar18 + fVar25 * fVar17;
    out->d1 = fVar9 * fVar32 + fVar8 * fVar31 + fVar6 * fVar30 + fVar5 * fVar29;
    out->d2 = fVar12 * fVar32 + fVar11 * fVar31 + fVar7 * fVar30 + fVar10 * fVar29;
    out->d3 = fVar16 * fVar32 + fVar15 * fVar31 + fVar14 * fVar30 + fVar13 * fVar29;
    out->d4 = fVar20 * fVar32 + fVar19 * fVar31 + fVar18 * fVar30 + fVar29 * fVar17;
  }
  return;
}

Assistant:

void FBXConverter::GetRotationMatrix(Model::RotOrder mode, const aiVector3D& rotation, aiMatrix4x4& out)
        {
            if (mode == Model::RotOrder_SphericXYZ) {
                FBXImporter::LogError("Unsupported RotationMode: SphericXYZ");
                out = aiMatrix4x4();
                return;
            }

            const float angle_epsilon = Math::getEpsilon<float>();

            out = aiMatrix4x4();

            bool is_id[3] = { true, true, true };

            aiMatrix4x4 temp[3];
            if (std::fabs(rotation.z) > angle_epsilon) {
                aiMatrix4x4::RotationZ(AI_DEG_TO_RAD(rotation.z), temp[2]);
                is_id[2] = false;
            }
            if (std::fabs(rotation.y) > angle_epsilon) {
                aiMatrix4x4::RotationY(AI_DEG_TO_RAD(rotation.y), temp[1]);
                is_id[1] = false;
            }
            if (std::fabs(rotation.x) > angle_epsilon) {
                aiMatrix4x4::RotationX(AI_DEG_TO_RAD(rotation.x), temp[0]);
                is_id[0] = false;
            }

            int order[3] = { -1, -1, -1 };

            // note: rotation order is inverted since we're left multiplying as is usual in assimp
            switch (mode)
            {
            case Model::RotOrder_EulerXYZ:
                order[0] = 2;
                order[1] = 1;
                order[2] = 0;
                break;

            case Model::RotOrder_EulerXZY:
                order[0] = 1;
                order[1] = 2;
                order[2] = 0;
                break;

            case Model::RotOrder_EulerYZX:
                order[0] = 0;
                order[1] = 2;
                order[2] = 1;
                break;

            case Model::RotOrder_EulerYXZ:
                order[0] = 2;
                order[1] = 0;
                order[2] = 1;
                break;

            case Model::RotOrder_EulerZXY:
                order[0] = 1;
                order[1] = 0;
                order[2] = 2;
                break;

            case Model::RotOrder_EulerZYX:
                order[0] = 0;
                order[1] = 1;
                order[2] = 2;
                break;

            default:
                ai_assert(false);
                break;
            }

            ai_assert(order[0] >= 0);
            ai_assert(order[0] <= 2);
            ai_assert(order[1] >= 0);
            ai_assert(order[1] <= 2);
            ai_assert(order[2] >= 0);
            ai_assert(order[2] <= 2);

            if (!is_id[order[0]]) {
                out = temp[order[0]];
            }

            if (!is_id[order[1]]) {
                out = out * temp[order[1]];
            }

            if (!is_id[order[2]]) {
                out = out * temp[order[2]];
            }
        }